

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVD.hpp
# Opt level: O3

void __thiscall JAMA::SVD<double>::SVD(SVD<double> *this,DynamicRectMatrix<double> *Arg)

{
  pointer pdVar1;
  double *pdVar2;
  double **ppdVar3;
  long lVar4;
  double *pdVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  double **ppdVar16;
  int iVar17;
  ulong uVar18;
  pointer pdVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  double **ppdVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  double dVar30;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  DynamicVector<double,_std::allocator<double>_> e;
  DynamicRectMatrix<double> A;
  DynamicVector<double,_std::allocator<double>_> work;
  vector<double,_std::allocator<double>_> local_108;
  ulong local_e8;
  DynamicRectMatrix<double> *local_e0;
  undefined1 local_d8 [16];
  ulong local_c0;
  undefined1 local_b8 [16];
  ulong local_a0;
  double **local_98;
  ulong local_90;
  DynamicRectMatrix<double> local_88;
  pointer local_78;
  ulong local_70;
  vector<double,_std::allocator<double>_> local_68;
  DynamicRectMatrix<double> local_50;
  DynamicRectMatrix<double> local_40;
  
  local_e0 = &this->V;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->V).data_ = (double **)0x0;
  (this->V).nrow_ = 0;
  (this->V).ncol_ = 0;
  (this->U).data_ = (double **)0x0;
  (this->U).nrow_ = 0;
  (this->U).ncol_ = 0;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = Arg->nrow_;
  this->m = uVar10;
  uVar11 = Arg->ncol_;
  this->n = uVar11;
  uVar15 = uVar10;
  if ((int)uVar11 < (int)uVar10) {
    uVar15 = uVar11;
  }
  uVar13 = uVar10 + 1;
  if ((int)uVar11 < (int)(uVar10 + 1)) {
    uVar13 = uVar11;
  }
  std::vector<double,_std::allocator<double>_>::vector
            (&local_108,(long)(int)uVar13,(allocator_type *)&local_68);
  pdVar19 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar1 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_start;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pdVar19 != (pointer)0x0) &&
     (operator_delete(pdVar19,(long)pdVar1 - (long)pdVar19),
     (double **)
     local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start != (double **)0x0)) {
    operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)&local_108,this->m,uVar15,0.0);
  OpenMD::DynamicRectMatrix<double>::operator=(&local_40,&this->U);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_40);
  OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_108);
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix
            ((DynamicRectMatrix<double> *)&local_108,this->n,this->n);
  OpenMD::DynamicRectMatrix<double>::operator=(&local_50,local_e0);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_50);
  OpenMD::DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_108);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_108,(long)this->n,(allocator_type *)&local_68);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,(long)this->m,(allocator_type *)&local_88);
  local_d8._0_4_ = uVar15;
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix(&local_88,Arg);
  uVar10 = this->m;
  uVar27 = (ulong)uVar10;
  uVar11 = this->n;
  uVar15 = uVar10 - 1;
  if ((int)uVar11 < (int)(uVar10 - 1)) {
    uVar15 = uVar11;
  }
  local_c0 = (ulong)uVar15;
  uVar13 = uVar11 - 2;
  if ((int)uVar10 < (int)(uVar11 - 2)) {
    uVar13 = uVar10;
  }
  pdVar19 = (pointer)0x0;
  if (0 < (int)uVar13) {
    pdVar19 = (pointer)(ulong)uVar13;
  }
  uVar9 = (uint)pdVar19;
  if ((int)(uint)pdVar19 < (int)uVar15) {
    uVar9 = uVar15;
  }
  local_90 = (ulong)(int)uVar13;
  lVar25 = (long)(int)uVar15;
  if (uVar9 != 0) {
    local_70 = (ulong)uVar9;
    uVar20 = 1;
    uVar26 = 0;
    local_78 = pdVar19;
    do {
      if ((long)uVar26 < lVar25) {
        pdVar19 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar19[uVar26] = 0.0;
        if ((long)uVar26 < (long)(int)uVar27) {
          dVar30 = 0.0;
          uVar29 = uVar26;
          do {
            dVar30 = hypot(dVar30,local_88.data_[uVar29][uVar26]);
            pdVar19 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar19[uVar26] = dVar30;
            uVar29 = uVar29 + 1;
            uVar10 = this->m;
            uVar27 = (ulong)uVar10;
          } while ((int)uVar29 < (int)uVar10);
          auVar33._0_8_ = pdVar19 + uVar26;
          if ((dVar30 != 0.0) || (NAN(dVar30))) {
            pdVar2 = local_88.data_[uVar26];
            if (pdVar2[uVar26] <= 0.0 && pdVar2[uVar26] != 0.0) {
              *auVar33._0_8_ = -dVar30;
            }
            uVar29 = uVar26;
            if ((long)uVar26 < (long)(int)uVar10) {
              do {
                local_88.data_[uVar29][uVar26] = local_88.data_[uVar29][uVar26] / *auVar33._0_8_;
                uVar29 = uVar29 + 1;
              } while (uVar27 != uVar29);
            }
            pdVar2[uVar26] = pdVar2[uVar26] + 1.0;
            dVar30 = *auVar33._0_8_;
          }
        }
        else {
          auVar33._0_8_ = pdVar19 + uVar26;
          dVar30 = 0.0;
        }
        *auVar33._0_8_ = -dVar30;
      }
      uVar29 = uVar26 + 1;
      uVar10 = this->n;
      if ((long)uVar29 < (long)(int)uVar10) {
        local_b8._0_8_ = uVar29;
        pdVar19 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar11 = this->m;
        uVar27 = (ulong)uVar11;
        auVar33._0_8_ = local_88.data_[uVar26];
        uVar21 = uVar20;
        do {
          if (((long)uVar26 < lVar25) &&
             (pdVar19[uVar26] != 0.0 && (long)uVar26 < (long)(int)uVar11)) {
            dVar30 = 0.0;
            uVar22 = uVar26;
            do {
              dVar30 = dVar30 + local_88.data_[uVar22][uVar26] * local_88.data_[uVar22][uVar21];
              uVar22 = uVar22 + 1;
            } while (uVar27 != uVar22);
            if ((long)uVar26 < (long)(int)uVar11) {
              dVar35 = auVar33._0_8_[uVar26];
              uVar22 = uVar26;
              do {
                pdVar2 = local_88.data_[uVar22];
                pdVar2[uVar21] = pdVar2[uVar26] * (-dVar30 / dVar35) + pdVar2[uVar21];
                uVar22 = uVar22 + 1;
              } while (uVar27 != uVar22);
            }
          }
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar21] = (double)auVar33._0_8_[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar21 != uVar10);
      }
      if ((long)uVar26 < lVar25) {
        uVar10 = this->m;
        uVar27 = (ulong)(int)uVar10;
        if ((long)uVar26 < (long)uVar27) {
          ppdVar16 = (this->U).data_;
          uVar21 = uVar26;
          do {
            ppdVar16[uVar21][uVar26] = local_88.data_[uVar21][uVar26];
            uVar21 = uVar21 + 1;
          } while (uVar10 != uVar21);
        }
      }
      if ((long)uVar26 < (long)local_90) {
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar26] = 0.0;
        uVar21 = (ulong)this->n;
        if ((long)uVar29 < (long)uVar21) {
          local_b8._0_8_ = uVar29;
          local_98 = (double **)(uVar26 * 8);
          auVar33 = ZEXT816(0);
          local_e8 = uVar20;
          do {
            auVar33._0_8_ =
                 (double *)
                 hypot(auVar33._0_8_,
                       (double)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar20]);
            ppdVar16 = (double **)
                       local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            auVar33._8_8_ = extraout_XMM0_Qb;
            local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar26] = (double)auVar33._0_8_;
            uVar20 = uVar20 + 1;
            uVar10 = this->n;
            uVar21 = (ulong)uVar10;
          } while ((int)uVar20 < (int)uVar10);
          if (((double)auVar33._0_8_ != 0.0) || (NAN((double)auVar33._0_8_))) {
            pdVar2 = (double *)
                     local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[local_b8._0_8_];
            if ((double)pdVar2 < 0.0) {
              auVar33._0_8_ = (double *)((ulong)auVar33._0_8_ ^ 0x8000000000000000);
              local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar26] = (double)auVar33._0_8_;
            }
            uVar27 = local_e8;
            if ((long)local_b8._0_8_ < (long)(int)uVar10) {
              do {
                local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar27] =
                     (double)((double)local_108.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar27] /
                             (double)local_108.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar26]);
                uVar27 = uVar27 + 1;
              } while (uVar21 != uVar27);
              pdVar2 = (double *)
                       local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[local_b8._0_8_];
              auVar33._0_8_ =
                   (double *)
                   local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar26];
            }
            local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[local_b8._0_8_] = (double)((double)pdVar2 + 1.0);
          }
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = -(double)auVar33._0_8_;
          uVar11 = this->m;
          uVar27 = (ulong)(int)uVar11;
          uVar20 = local_e8;
          uVar29 = local_b8._0_8_;
          if ((double)auVar33._0_8_ == (double)-(double)auVar33._0_8_ ||
              (long)uVar27 <= (long)local_b8._0_8_) goto LAB_00257e3c;
          lVar28 = (long)local_98 + 8;
          local_98 = (double **)(long)(int)uVar10;
          memset((void *)((long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start + lVar28),0,
                 (ulong)((uVar11 - (int)uVar26) - 2) * 8 + 8);
          uVar20 = local_e8;
          uVar29 = local_b8._0_8_;
          ppdVar24 = local_98;
          if ((long)local_b8._0_8_ < (long)local_98) {
            uVar22 = local_e8;
            uVar18 = local_e8;
            do {
              do {
                local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar22] =
                     (double)((pointer)ppdVar16)[uVar18] * local_88.data_[uVar22][uVar18] +
                     local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar22];
                uVar22 = uVar22 + 1;
              } while (uVar11 != uVar22);
              uVar18 = uVar18 + 1;
              uVar22 = local_e8;
            } while (uVar18 != uVar21);
            if ((long)local_b8._0_8_ < (long)local_98) {
              do {
                auVar33._0_8_ = (double *)((pointer)ppdVar16)[uVar22];
                pdVar2 = (double *)((pointer)ppdVar16)[local_b8._0_8_];
                uVar18 = local_e8;
                do {
                  local_88.data_[uVar18][uVar22] =
                       local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar18] *
                       (-(double)auVar33._0_8_ / (double)pdVar2) + local_88.data_[uVar18][uVar22];
                  uVar18 = uVar18 + 1;
                } while (uVar11 != uVar18);
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar21);
            }
          }
        }
        else {
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar26] = -0.0;
          uVar27 = (ulong)(uint)this->m;
LAB_00257e3c:
          ppdVar24 = (double **)(long)(int)uVar21;
          ppdVar16 = (double **)
                     local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
        if ((long)uVar29 < (long)ppdVar24) {
          ppdVar24 = local_e0->data_;
          uVar22 = uVar20;
          do {
            ppdVar24[uVar22][uVar26] = (double)ppdVar16[uVar22];
            uVar22 = uVar22 + 1;
          } while ((uVar21 & 0xffffffff) != uVar22);
        }
      }
      uVar20 = uVar20 + 1;
      uVar26 = uVar29;
    } while (uVar29 != local_70);
    uVar10 = this->m;
    uVar11 = this->n;
    pdVar19 = local_78;
  }
  uVar27 = (ulong)uVar11;
  uVar15 = uVar10 + 1;
  if ((int)uVar11 <= (int)(uVar10 + 1)) {
    uVar15 = uVar11;
  }
  uVar20 = (ulong)uVar15;
  iVar12 = (int)local_c0;
  uVar26 = local_c0 & 0xffffffff;
  if (iVar12 < (int)uVar11) {
    (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar25] = local_88.data_[uVar26][uVar26];
  }
  if ((int)uVar10 < (int)uVar11) {
    (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[(long)(int)uVar15 + -1] = 0.0;
  }
  if ((int)pdVar19 + 1 < (int)uVar15) {
    local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[(ulong)pdVar19 & 0xffffffff] =
         (double)local_88.data_[(ulong)pdVar19 & 0xffffffff][uVar15 - 1];
  }
  local_70 = (ulong)(int)(uVar15 - 1);
  local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[local_70] = 0.0;
  if (iVar12 < (int)local_d8._0_4_) {
    ppdVar16 = (this->U).data_;
    uVar29 = local_c0 & 0xffffffff;
    do {
      if (0 < (int)uVar10) {
        uVar21 = 0;
        do {
          ppdVar16[uVar21][uVar29] = 0.0;
          uVar21 = uVar21 + 1;
        } while (uVar10 != uVar21);
      }
      ppdVar16[uVar29][uVar29] = 1.0;
      uVar13 = (int)uVar29 + 1;
      uVar29 = (ulong)uVar13;
    } while (uVar13 != local_d8._0_4_);
  }
  auVar37 = _DAT_0028ce60;
  local_e8 = (ulong)(int)local_d8._0_4_;
  if (0 < iVar12) {
    ppdVar24 = (this->U).data_;
    local_78 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar29 = (ulong)(iVar12 - 1);
    uVar13 = iVar12 - 2;
    lVar28 = (long)(int)uVar10;
    lVar25 = uVar29 * 8;
    ppdVar16 = ppdVar24 + uVar29;
    do {
      uVar22 = (ulong)uVar13;
      uVar21 = uVar26 - 1;
      if ((local_78[uVar26 - 1] != 0.0) || (NAN(local_78[uVar26 - 1]))) {
        iVar12 = (int)uVar29;
        if ((long)uVar26 < (long)local_e8) {
          auVar33._0_8_ = ppdVar24[uVar21];
          local_b8._0_8_ = auVar33._0_8_;
          ppdVar3 = (this->U).data_;
          uVar18 = uVar26;
          do {
            if ((long)uVar26 <= lVar28) {
              dVar30 = 0.0;
              lVar23 = 0;
              do {
                lVar4 = *(long *)((long)ppdVar3 + lVar23 * 8 + lVar25);
                dVar30 = dVar30 + *(double *)(lVar4 + uVar21 * 8) * *(double *)(lVar4 + uVar18 * 8);
                lVar23 = lVar23 + 1;
              } while (iVar12 + (int)lVar23 < (int)uVar10);
              if ((long)uVar26 <= lVar28) {
                dVar35 = auVar33._0_8_[uVar21];
                lVar23 = 0;
                do {
                  pdVar2 = ppdVar16[lVar23];
                  pdVar2[uVar18] =
                       pdVar2[uVar21] * ((double)((ulong)dVar30 ^ auVar37._0_8_) / dVar35) +
                       pdVar2[uVar18];
                  lVar23 = lVar23 + 1;
                } while (iVar12 + (int)lVar23 < (int)uVar10);
              }
            }
            uVar18 = uVar18 + 1;
          } while ((int)uVar18 < (int)local_d8._0_4_);
        }
        if ((long)uVar26 <= lVar28) {
          lVar23 = 0;
          do {
            ppdVar16[lVar23][uVar21] = (double)((ulong)ppdVar16[lVar23][uVar21] ^ auVar37._0_8_);
            lVar23 = lVar23 + 1;
          } while ((int)lVar23 + iVar12 < (int)uVar10);
        }
        ppdVar24[uVar21][uVar21] = ppdVar24[uVar21][uVar21] + 1.0;
        local_c0 = uVar22;
        if (2 < (long)uVar26) {
          uVar18 = 0;
          do {
            ppdVar24[uVar18][uVar21] = 0.0;
            uVar18 = uVar18 + 1;
          } while (uVar22 != uVar18);
        }
      }
      else {
        if (0 < (int)uVar10) {
          uVar22 = 0;
          do {
            ppdVar24[uVar22][uVar21] = 0.0;
            uVar22 = uVar22 + 1;
          } while (uVar10 != uVar22);
        }
        ppdVar24[uVar21][uVar21] = 1.0;
      }
      uVar29 = uVar29 - 1;
      uVar13 = uVar13 - 1;
      lVar25 = lVar25 + -8;
      ppdVar16 = ppdVar16 + -1;
      bVar6 = 1 < (long)uVar26;
      uVar26 = uVar21;
    } while (bVar6);
  }
  uVar26 = uVar20;
  local_a0 = uVar20;
  uVar29 = uVar20;
  local_98 = (double **)
             local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  auVar37 = _DAT_0028ce90;
  auVar8 = local_d8;
  if (0 < (int)uVar11) {
    ppdVar24 = local_e0->data_;
    ppdVar16 = ppdVar24 + uVar27;
    lVar25 = 0;
    uVar22 = (ulong)DAT_0028ce60;
    uVar21 = uVar27;
    do {
      uVar18 = uVar21 - 1;
      if (((long)uVar21 < (long)local_e8 && (long)uVar21 <= (long)local_90) &&
          (double)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar21 - 1] != 0.0) {
        auVar33._0_8_ = ppdVar24[uVar21];
        ppdVar3 = local_e0->data_;
        uVar14 = uVar21;
        do {
          if ((long)uVar21 < (long)uVar27) {
            dVar30 = 0.0;
            lVar28 = lVar25;
            do {
              dVar30 = dVar30 + ppdVar3[uVar27 + lVar28][uVar18] * ppdVar3[uVar27 + lVar28][uVar14];
              lVar28 = lVar28 + 1;
            } while ((int)((int)lVar28 + uVar11) < (int)uVar11);
            if ((long)uVar21 < (long)uVar27) {
              dVar35 = auVar33._0_8_[uVar18];
              lVar28 = 0;
              do {
                pdVar2 = ppdVar16[lVar28];
                pdVar2[uVar14] =
                     pdVar2[uVar18] * ((double)((ulong)dVar30 ^ uVar22) / dVar35) + pdVar2[uVar14];
                lVar28 = lVar28 + 1;
              } while ((int)lVar28 + (int)uVar21 < (int)uVar11);
            }
          }
          uVar14 = uVar14 + 1;
        } while ((int)uVar14 < (int)local_d8._0_4_);
      }
      uVar14 = 0;
      do {
        ppdVar24[uVar14][uVar18] = 0.0;
        uVar14 = uVar14 + 1;
      } while (uVar27 != uVar14);
      ppdVar24[uVar18][uVar18] = 1.0;
      lVar25 = lVar25 + -1;
      ppdVar16 = ppdVar16 + -1;
      bVar6 = 1 < (long)uVar21;
      uVar21 = uVar18;
      auVar37 = _DAT_0028ce90;
    } while (bVar6);
  }
  do {
    local_d8 = auVar8;
    if ((int)uVar15 < 1) {
      OpenMD::DynamicRectMatrix<double>::deallocate(&local_88);
      if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((double **)
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double **)0x0) {
        operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    iVar12 = (int)uVar20;
    uVar10 = iVar12 - 2;
    uVar11 = 0xffffffff;
    uVar27 = auVar37._0_8_;
    if (uVar10 != 0xffffffff) {
      uVar21 = uVar20 & 0xffffffff;
      do {
        auVar33 = *(undefined1 (*) [16])
                   ((this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + (uVar21 - 2)) & auVar37;
        if ((double)((ulong)((double **)
                            local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start)[uVar21 - 2] & uVar27) <=
            (auVar33._8_8_ + auVar33._0_8_) * 2.220446049250313e-16) {
          uVar11 = (int)uVar21 - 2;
          ((double **)
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start)[uVar21 - 2] = (double *)0x0;
          break;
        }
        uVar21 = uVar21 - 1;
      } while (uVar21 != 1);
    }
    uVar15 = iVar12 - 1;
    local_90 = uVar29;
    if (uVar11 == uVar10) {
      pdVar19 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar30 = pdVar19[(int)uVar15];
      if (dVar30 <= 0.0) {
        pdVar19[(int)uVar15] = (double)(-(ulong)(dVar30 < -dVar30) & (ulong)-dVar30);
        ppdVar16 = local_e0->data_;
        uVar27 = 0;
        do {
          ppdVar16[uVar27][uVar15] = -ppdVar16[uVar27][uVar15];
          uVar27 = uVar27 + 1;
        } while (uVar26 != uVar27);
      }
      if (iVar12 < (int)local_a0) {
        uVar10 = this->n;
        ppdVar16 = (this->U).data_;
        ppdVar24 = (this->V).data_;
        uVar11 = this->m;
        uVar27 = (uVar20 & 0xffffffff) - 1;
        do {
          dVar30 = pdVar19[uVar27];
          if (pdVar19[uVar27 + 1] <= dVar30) break;
          uVar20 = uVar27 + 1;
          pdVar19[uVar27] = pdVar19[uVar27 + 1];
          pdVar19[uVar20] = dVar30;
          if ((long)uVar27 < (long)(int)uVar10 + -1 && 0 < (int)uVar10) {
            uVar26 = 0;
            do {
              auVar33._0_8_ = ppdVar24[uVar26];
              dVar30 = auVar33._0_8_[uVar20];
              auVar33._0_8_[uVar20] = auVar33._0_8_[uVar27 & 0xffffffff];
              auVar33._0_8_[uVar27 & 0xffffffff] = dVar30;
              uVar26 = uVar26 + 1;
            } while (uVar10 != uVar26);
          }
          if ((long)uVar27 < (long)(int)uVar11 + -1 && 0 < (int)uVar11) {
            uVar26 = 0;
            do {
              auVar33._0_8_ = ppdVar16[uVar26];
              dVar30 = auVar33._0_8_[uVar20];
              auVar33._0_8_[uVar20] = auVar33._0_8_[uVar27 & 0xffffffff];
              auVar33._0_8_[uVar27 & 0xffffffff] = dVar30;
              uVar26 = uVar26 + 1;
            } while (uVar11 != uVar26);
          }
          uVar27 = uVar20;
        } while (uVar20 != local_70);
      }
      uVar20 = (ulong)(iVar12 - 1);
      uVar26 = uVar29;
    }
    else {
      uVar29 = (ulong)uVar15;
      if ((int)uVar11 < (int)uVar15) {
        pdVar19 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar29 = (uVar20 & 0xffffffff) - 1;
        do {
          dVar30 = 0.0;
          if ((long)(int)(uVar11 + 1) != uVar29) {
            dVar30 = (double)((ulong)((double **)
                                     local_108.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start)[uVar29 - 1] & uVar27)
            ;
          }
          if ((double)((ulong)pdVar19[uVar29] & uVar27) <=
              ((double)((ulong)((double **)
                               local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start)[uVar29] & uVar27) + dVar30) *
              2.220446049250313e-16) {
            pdVar19[uVar29] = 0.0;
            break;
          }
          uVar29 = uVar29 - 1;
        } while ((long)(int)uVar11 < (long)uVar29);
      }
      uVar13 = (uint)uVar29;
      if (uVar13 == uVar11) {
        lVar25 = (long)(int)uVar11;
        pdVar19 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar32 = ABS(pdVar19[uVar15]);
        uVar27 = (ulong)(int)uVar10;
        dVar30 = ABS(pdVar19[uVar27]);
        auVar31._8_8_ =
             ((double **)
             local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start)[uVar27];
        auVar31._0_8_ = pdVar19[uVar15];
        dVar35 = ABS((double)((double **)
                             local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start)[uVar27]);
        if (dVar30 <= dVar32) {
          dVar30 = dVar32;
        }
        dVar32 = ABS(pdVar19[lVar25 + 1]);
        if (dVar35 <= dVar30) {
          dVar35 = dVar30;
        }
        dVar30 = ABS((double)((double **)
                             local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start)[lVar25 + 1]);
        if (dVar32 <= dVar35) {
          dVar32 = dVar35;
        }
        if (dVar30 <= dVar32) {
          dVar30 = dVar32;
        }
        dVar34 = pdVar19[uVar27] / dVar30;
        auVar7._8_8_ = dVar30;
        auVar7._0_8_ = dVar30;
        auVar33 = divpd(auVar31,auVar7);
        dVar35 = auVar33._0_8_;
        dVar32 = auVar33._8_8_;
        dVar36 = (dVar32 * dVar32 + (dVar34 - dVar35) * (dVar34 + dVar35)) * 0.5;
        dVar34 = dVar35 * dVar32 * dVar35 * dVar32;
        dVar32 = 0.0;
        if ((((dVar36 != 0.0) || (NAN(dVar36))) || (dVar34 != 0.0)) || (NAN(dVar34))) {
          dVar32 = SQRT(dVar36 * dVar36 + dVar34);
          dVar32 = dVar34 / ((double)((ulong)-dVar32 & -(ulong)(dVar36 < 0.0) |
                                     ~-(ulong)(dVar36 < 0.0) & (ulong)dVar32) + dVar36);
        }
        uVar29 = lVar25 + 1;
        dVar34 = pdVar19[lVar25 + 1] / dVar30;
        local_d8._8_8_ = 0;
        auVar33._0_8_ = (double *)((dVar34 - dVar35) * (dVar34 + dVar35) + dVar32);
        local_e8 = uVar20;
        if ((int)uVar29 < (int)uVar15) {
          dVar34 = dVar34 * ((double)((double **)
                                     local_108.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start)[lVar25 + 1] / dVar30)
          ;
          uVar20 = uVar29;
          local_c0 = uVar27;
          do {
            local_b8._8_8_ = 0;
            local_b8._0_8_ = dVar34;
            local_d8._0_8_ = auVar33._0_8_;
            auVar33._0_8_ = (double *)hypot((double)auVar33._0_8_,dVar34);
            if (uVar20 != uVar29) {
              local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar20 - 1] = (double)auVar33._0_8_;
            }
            dVar32 = (double)local_d8._0_8_ / (double)auVar33._0_8_;
            local_b8._0_8_ = (double)local_b8._0_8_ / (double)auVar33._0_8_;
            pdVar19 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar30 = pdVar19[uVar20];
            auVar33._0_8_ =
                 (double *)
                 local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar20];
            local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar20] =
                 (double)(dVar32 * (double)auVar33._0_8_ - dVar30 * (double)local_b8._0_8_);
            uVar21 = uVar20 + 1;
            dVar35 = pdVar19[uVar20 + 1];
            pdVar19[uVar20 + 1] = dVar32 * dVar35;
            iVar12 = this->n;
            if (0 < (long)iVar12) {
              ppdVar16 = local_e0->data_;
              lVar25 = 0;
              do {
                pdVar2 = ppdVar16[lVar25];
                dVar34 = pdVar2[uVar20 & 0xffffffff];
                dVar36 = pdVar2[uVar21];
                pdVar2[uVar21] = dVar34 * -(double)local_b8._0_8_ + dVar36 * dVar32;
                pdVar2[uVar20 & 0xffffffff] = dVar32 * dVar34 + (double)local_b8._0_8_ * dVar36;
                lVar25 = lVar25 + 1;
              } while (iVar12 != lVar25);
            }
            local_d8._0_8_ = dVar32 * dVar30 + (double)auVar33._0_8_ * (double)local_b8._0_8_;
            local_b8._0_8_ = dVar35 * (double)local_b8._0_8_;
            local_b8._8_8_ = 0;
            dVar30 = hypot((double)local_d8._0_8_,(double)local_b8._0_8_);
            dVar35 = (double)local_d8._0_8_ / dVar30;
            dVar34 = (double)local_b8._0_8_ / dVar30;
            pdVar19 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar19[uVar20] = dVar30;
            auVar33._0_8_ =
                 (double *)
                 local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar20];
            dVar30 = pdVar19[uVar21];
            pdVar19[uVar21] = dVar35 * dVar30 - dVar34 * (double)auVar33._0_8_;
            pdVar2 = (double *)
                     local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21];
            local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar21] = (double)(dVar35 * (double)pdVar2);
            lVar25 = (long)this->m;
            if ((long)uVar20 < lVar25 + -1 && 0 < lVar25) {
              ppdVar16 = (this->U).data_;
              lVar28 = 0;
              do {
                pdVar5 = ppdVar16[lVar28];
                dVar32 = pdVar5[uVar20 & 0xffffffff];
                dVar36 = pdVar5[uVar21];
                pdVar5[uVar21] = dVar32 * -dVar34 + dVar36 * dVar35;
                pdVar5[uVar20 & 0xffffffff] = dVar35 * dVar32 + dVar34 * dVar36;
                lVar28 = lVar28 + 1;
              } while (lVar25 != lVar28);
            }
            auVar33._0_8_ = (double *)(dVar35 * (double)auVar33._0_8_ + dVar30 * dVar34);
            dVar34 = (double)pdVar2 * dVar34;
            uVar27 = local_c0;
            uVar20 = uVar21;
            auVar37 = _DAT_0028ce90;
            auVar8 = local_d8;
          } while (uVar15 != (uint)uVar21);
        }
        local_d8 = auVar8;
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar27] = (double)auVar33._0_8_;
        uVar20 = local_e8;
      }
      else {
        uVar9 = uVar13;
        if (uVar13 == uVar15) {
          uVar9 = uVar11;
        }
        iVar17 = uVar9 + 1;
        if (uVar13 == uVar15) {
          local_d8._8_8_ = 0;
          local_d8._0_8_ =
               ((double **)
               local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start)[(int)uVar10];
          ((double **)
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start)[(int)uVar10] = (double *)0x0;
          if ((int)uVar11 < (int)uVar10) {
            uVar27 = (uVar20 & 0xffffffff) - 2;
            do {
              dVar30 = hypot((this->s).data_.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar27],(double)local_d8._0_8_
                            );
              pdVar19 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              dVar35 = pdVar19[uVar27] / dVar30;
              dVar32 = (double)local_d8._0_8_ / dVar30;
              pdVar19[uVar27] = dVar30;
              if (uVar27 != (long)iVar17) {
                local_d8._8_8_ = local_d8._8_8_ ^ 0x8000000000000000;
                local_d8._0_8_ =
                     -dVar32 * local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[uVar27 - 1];
                local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar27 - 1] =
                     (double)((double)local_108.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar27 - 1] * dVar35)
                ;
              }
              iVar12 = this->n;
              if (0 < (long)iVar12) {
                ppdVar16 = local_e0->data_;
                lVar25 = 0;
                do {
                  auVar33._0_8_ = ppdVar16[lVar25];
                  dVar30 = auVar33._0_8_[uVar27 & 0xffffffff];
                  dVar34 = auVar33._0_8_[uVar15];
                  auVar33._0_8_[uVar15] = dVar30 * -dVar32 + dVar34 * dVar35;
                  auVar33._0_8_[uVar27 & 0xffffffff] = dVar35 * dVar30 + dVar32 * dVar34;
                  lVar25 = lVar25 + 1;
                } while (iVar12 != lVar25);
              }
              uVar27 = uVar27 - 1;
              uVar26 = local_90;
              auVar37 = _DAT_0028ce90;
            } while ((long)(int)uVar11 < (long)uVar27);
          }
        }
        else {
          auVar33._0_8_ =
               ((double **)
               local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start)[(int)uVar13];
          ((double **)
          local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start)[(int)uVar13] = (double *)0x0;
          if (iVar17 < iVar12) {
            uVar27 = (ulong)iVar17;
            do {
              local_d8._8_8_ = 0;
              local_d8._0_8_ = auVar33._0_8_;
              dVar30 = hypot((this->s).data_.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar27],(double)auVar33._0_8_)
              ;
              pdVar19 = (this->s).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              dVar35 = pdVar19[uVar27] / dVar30;
              pdVar19[uVar27] = dVar30;
              dVar32 = -((double)local_d8._0_8_ / dVar30);
              auVar33._0_8_ =
                   (double *)
                   local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar27];
              local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar27] = (double)(dVar35 * (double)auVar33._0_8_);
              iVar17 = this->m;
              if (0 < (long)iVar17) {
                ppdVar16 = (this->U).data_;
                lVar25 = 0;
                do {
                  pdVar2 = ppdVar16[lVar25];
                  dVar34 = pdVar2[uVar27 & 0xffffffff];
                  dVar36 = pdVar2[uVar29 & 0xffffffff];
                  pdVar2[uVar29 & 0xffffffff] = dVar34 * dVar32 + dVar36 * dVar35;
                  pdVar2[uVar27 & 0xffffffff] =
                       dVar35 * dVar34 + ((double)local_d8._0_8_ / dVar30) * dVar36;
                  lVar25 = lVar25 + 1;
                } while (iVar17 != lVar25);
              }
              auVar33._0_8_ = (double *)((double)auVar33._0_8_ * dVar32);
              uVar27 = uVar27 + 1;
              auVar37 = _DAT_0028ce90;
            } while (iVar12 != (int)uVar27);
          }
        }
      }
    }
    uVar15 = (uint)uVar20;
    uVar29 = local_90;
    auVar8 = local_d8;
  } while( true );
}

Assistant:

SVD(const DynamicRectMatrix<Real>& Arg) {
      m      = Arg.getNRow();
      n      = Arg.getNCol();
      int nu = min(m, n);
      s      = DynamicVector<Real>(min(m + 1, n));
      U      = DynamicRectMatrix<Real>(m, nu, Real(0));
      V      = DynamicRectMatrix<Real>(n, n);
      DynamicVector<Real> e(n);
      DynamicVector<Real> work(m);
      DynamicRectMatrix<Real> A(Arg);

      int wantu = 1; /* boolean */
      int wantv = 1; /* boolean */
      int i = 0, j = 0, k = 0;

      // Reduce A to bidiagonal form, storing the diagonal elements
      // in s and the super-diagonal elements in e.

      int nct = min(m - 1, n);
      int nrt = max(0, min(n - 2, m));

      for (k = 0; k < max(nct, nrt); k++) {
        if (k < nct) {
          // Compute the transformation for the k-th column and
          // place the k-th diagonal in s(k).
          // Compute 2-norm of k-th column without under/overflow.
          s(k) = 0;
          for (i = k; i < m; i++) {
            s(k) = hypot(s(k), A(i, k));
          }
          if (s(k) != 0.0) {
            if (A(k, k) < 0.0) { s(k) = -s(k); }
            for (i = k; i < m; i++) {
              A(i, k) /= s(k);
            }
            A(k, k) += 1.0;
          }
          s(k) = -s(k);
        }
        for (j = k + 1; j < n; j++) {
          if ((k < nct) && (s(k) != 0.0)) {
            // Apply the transformation.

            Real t(0.0);
            for (i = k; i < m; i++) {
              t += A(i, k) * A(i, j);
            }
            t = -t / A(k, k);
            for (i = k; i < m; i++) {
              A(i, j) += t * A(i, k);
            }
          }

          // Place the k-th row of A into e for the
          // subsequent calculation of the row transformation.

          e(j) = A(k, j);
        }
        if (wantu & (k < nct)) {
          // Place the transformation in U for subsequent back
          // multiplication.

          for (i = k; i < m; i++) {
            U(i, k) = A(i, k);
          }
        }
        if (k < nrt) {
          // Compute the k-th row transformation and place the
          // k-th super-diagonal in e(k).
          // Compute 2-norm without under/overflow.
          e(k) = 0;
          for (i = k + 1; i < n; i++) {
            e(k) = hypot(e(k), e(i));
          }
          if (e(k) != 0.0) {
            if (e(k + 1) < 0.0) { e(k) = -e(k); }
            for (i = k + 1; i < n; i++) {
              e(i) /= e(k);
            }
            e(k + 1) += 1.0;
          }
          e(k) = -e(k);
          if ((k + 1 < m) & (e(k) != 0.0)) {
            // Apply the transformation.

            for (i = k + 1; i < m; i++) {
              work(i) = 0.0;
            }
            for (j = k + 1; j < n; j++) {
              for (i = k + 1; i < m; i++) {
                work(i) += e(j) * A(i, j);
              }
            }
            for (j = k + 1; j < n; j++) {
              Real t(-e(j) / e(k + 1));
              for (i = k + 1; i < m; i++) {
                A(i, j) += t * work(i);
              }
            }
          }
          if (wantv) {
            // Place the transformation in V for subsequent
            // back multiplication.

            for (i = k + 1; i < n; i++) {
              V(i, k) = e(i);
            }
          }
        }
      }

      // Set up the final bidiagonal matrix or order p.

      int p = min(n, m + 1);
      if (nct < n) { s(nct) = A(nct, nct); }
      if (m < p) { s(p - 1) = 0.0; }
      if (nrt + 1 < p) { e(nrt) = A(nrt, p - 1); }
      e(p - 1) = 0.0;

      // If required, generate U.

      if (wantu) {
        for (j = nct; j < nu; j++) {
          for (i = 0; i < m; i++) {
            U(i, j) = 0.0;
          }
          U(j, j) = 1.0;
        }
        for (k = nct - 1; k >= 0; k--) {
          if (s(k) != 0.0) {
            for (j = k + 1; j < nu; j++) {
              Real t(0.0);
              for (i = k; i < m; i++) {
                t += U(i, k) * U(i, j);
              }
              t = -t / U(k, k);
              for (i = k; i < m; i++) {
                U(i, j) += t * U(i, k);
              }
            }
            for (i = k; i < m; i++) {
              U(i, k) = -U(i, k);
            }
            U(k, k) = 1.0 + U(k, k);
            for (i = 0; i < k - 1; i++) {
              U(i, k) = 0.0;
            }
          } else {
            for (i = 0; i < m; i++) {
              U(i, k) = 0.0;
            }
            U(k, k) = 1.0;
          }
        }
      }

      // If required, generate V.

      if (wantv) {
        for (k = n - 1; k >= 0; k--) {
          if ((k < nrt) & (e(k) != 0.0)) {
            for (j = k + 1; j < nu; j++) {
              Real t(0.0);
              for (i = k + 1; i < n; i++) {
                t += V(i, k) * V(i, j);
              }
              t = -t / V(k + 1, k);
              for (i = k + 1; i < n; i++) {
                V(i, j) += t * V(i, k);
              }
            }
          }
          for (i = 0; i < n; i++) {
            V(i, k) = 0.0;
          }
          V(k, k) = 1.0;
        }
      }

      // Main iteration loop for the singular values.

      int pp   = p - 1;
      int iter = 0;
      Real eps(pow(2.0, -52.0));
      while (p > 0) {
        int k    = 0;
        int kase = 0;

        // Here is where a test for too many iterations would go.

        // This section of the program inspects for
        // negligible elements in the s and e arrays.  On
        // completion the variables kase and k are set as follows.

        // kase = 1     if s(p) and e(k-1) are negligible and k<p
        // kase = 2     if s(k) is negligible and k<p
        // kase = 3     if e(k-1) is negligible, k<p, and
        //              s(k), ..., s(p) are not negligible (qr step).
        // kase = 4     if e(p-1) is negligible (convergence).

        for (k = p - 2; k >= -1; k--) {
          if (k == -1) { break; }
          if (abs(e(k)) <= eps * (abs(s(k)) + abs(s(k + 1)))) {
            e(k) = 0.0;
            break;
          }
        }
        if (k == p - 2) {
          kase = 4;
        } else {
          int ks;
          for (ks = p - 1; ks >= k; ks--) {
            if (ks == k) { break; }
            Real t((ks != p ? abs(e(ks)) : 0.) +
                   (ks != k + 1 ? abs(e(ks - 1)) : 0.));
            if (abs(s(ks)) <= eps * t) {
              s(ks) = 0.0;
              break;
            }
          }
          if (ks == k) {
            kase = 3;
          } else if (ks == p - 1) {
            kase = 1;
          } else {
            kase = 2;
            k    = ks;
          }
        }
        k++;

        // Perform the task indicated by kase.

        switch (kase) {
          // Deflate negligible s(p).

        case 1: {
          Real f(e(p - 2));
          e(p - 2) = 0.0;
          for (j = p - 2; j >= k; j--) {
            Real t(hypot(s(j), f));
            Real cs(s(j) / t);
            Real sn(f / t);
            s(j) = t;
            if (j != k) {
              f        = -sn * e(j - 1);
              e(j - 1) = cs * e(j - 1);
            }
            if (wantv) {
              for (i = 0; i < n; i++) {
                t           = cs * V(i, j) + sn * V(i, p - 1);
                V(i, p - 1) = -sn * V(i, j) + cs * V(i, p - 1);
                V(i, j)     = t;
              }
            }
          }
        } break;

          // Split at negligible s(k).

        case 2: {
          Real f(e(k - 1));
          e(k - 1) = 0.0;
          for (j = k; j < p; j++) {
            Real t(hypot(s(j), f));
            Real cs(s(j) / t);
            Real sn(f / t);
            s(j) = t;
            f    = -sn * e(j);
            e(j) = cs * e(j);
            if (wantu) {
              for (i = 0; i < m; i++) {
                t           = cs * U(i, j) + sn * U(i, k - 1);
                U(i, k - 1) = -sn * U(i, j) + cs * U(i, k - 1);
                U(i, j)     = t;
              }
            }
          }
        } break;

          // Perform one qr step.

        case 3: {
          // Calculate the shift.

          Real scale =
              max(max(max(max(abs(s(p - 1)), abs(s(p - 2))), abs(e(p - 2))),
                      abs(s(k))),
                  abs(e(k)));
          Real sp    = s(p - 1) / scale;
          Real spm1  = s(p - 2) / scale;
          Real epm1  = e(p - 2) / scale;
          Real sk    = s(k) / scale;
          Real ek    = e(k) / scale;
          Real b     = ((spm1 + sp) * (spm1 - sp) + epm1 * epm1) / 2.0;
          Real c     = (sp * epm1) * (sp * epm1);
          Real shift = 0.0;
          if ((b != 0.0) || (c != 0.0)) {
            shift = sqrt(b * b + c);
            if (b < 0.0) { shift = -shift; }
            shift = c / (b + shift);
          }
          Real f = (sk + sp) * (sk - sp) + shift;
          Real g = sk * ek;

          // Chase zeros.

          for (j = k; j < p - 1; j++) {
            Real t  = hypot(f, g);
            Real cs = f / t;
            Real sn = g / t;
            if (j != k) { e(j - 1) = t; }
            f        = cs * s(j) + sn * e(j);
            e(j)     = cs * e(j) - sn * s(j);
            g        = sn * s(j + 1);
            s(j + 1) = cs * s(j + 1);
            if (wantv) {
              for (i = 0; i < n; i++) {
                t           = cs * V(i, j) + sn * V(i, j + 1);
                V(i, j + 1) = -sn * V(i, j) + cs * V(i, j + 1);
                V(i, j)     = t;
              }
            }
            t        = hypot(f, g);
            cs       = f / t;
            sn       = g / t;
            s(j)     = t;
            f        = cs * e(j) + sn * s(j + 1);
            s(j + 1) = -sn * e(j) + cs * s(j + 1);
            g        = sn * e(j + 1);
            e(j + 1) = cs * e(j + 1);
            if (wantu && (j < m - 1)) {
              for (i = 0; i < m; i++) {
                t           = cs * U(i, j) + sn * U(i, j + 1);
                U(i, j + 1) = -sn * U(i, j) + cs * U(i, j + 1);
                U(i, j)     = t;
              }
            }
          }
          e(p - 2) = f;
          iter     = iter + 1;
        } break;

          // Convergence.

        case 4: {
          // Make the singular values positive.

          if (s(k) <= 0.0) {
            s(k) = (s(k) < 0.0 ? -s(k) : 0.0);
            if (wantv) {
              for (i = 0; i <= pp; i++) {
                V(i, k) = -V(i, k);
              }
            }
          }

          // Order the singular values.

          while (k < pp) {
            if (s(k) >= s(k + 1)) { break; }
            Real t   = s(k);
            s(k)     = s(k + 1);
            s(k + 1) = t;
            if (wantv && (k < n - 1)) {
              for (i = 0; i < n; i++) {
                t           = V(i, k + 1);
                V(i, k + 1) = V(i, k);
                V(i, k)     = t;
              }
            }
            if (wantu && (k < m - 1)) {
              for (i = 0; i < m; i++) {
                t           = U(i, k + 1);
                U(i, k + 1) = U(i, k);
                U(i, k)     = t;
              }
            }
            k++;
          }
          iter = 0;
          p--;
        } break;
        }
      }
    }